

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void __thiscall
testing::internal::PairMatcherImpl<std::pair<int_const,int>const&>::PairMatcherImpl<int,int>
          (PairMatcherImpl<std::pair<int_const,int>const&> *this,int first_matcher,
          int second_matcher)

{
  int local_20;
  int local_1c;
  
  *(undefined ***)this = &PTR__PairMatcherImpl_0033d228;
  local_20 = second_matcher;
  local_1c = first_matcher;
  Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)(this + 8),&local_1c);
  Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)(this + 0x20),&local_20);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}